

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitQMark(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  AsmJsByteCodeWriter *this_00;
  AsmJsType *pAVar1;
  ParseNode *this_01;
  RegSlot RVar2;
  bool bVar3;
  ByteCodeLabel trueLabel;
  ByteCodeLabel falseLabel;
  RegSlot tmpReg;
  ParseNodeTri *pPVar4;
  AsmJsCompilationException *this_02;
  ulong uVar5;
  EmitExpressionInfo local_70;
  ByteCodeLabel local_64;
  EmitExpressionInfo local_60;
  ParseNode *local_58;
  ByteCodeLabel local_4c;
  EmitExpressionInfo local_48;
  uint local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  pPVar4 = ParseNode::AsParseNodeTri(pnode);
  StartStatement(this,pPVar4->pnode1);
  this_00 = &this->mWriter;
  trueLabel = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  falseLabel = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  local_4c = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  pPVar4 = ParseNode::AsParseNodeTri(pnode);
  ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pPVar4->pnode1);
  pPVar4 = ParseNode::AsParseNodeTri(pnode);
  local_64 = falseLabel;
  local_70 = EmitBooleanExpression(this,pPVar4->pnode1,trueLabel,falseLabel);
  AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_70);
  local_38 = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
  local_34 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
  tmpReg = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
  AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,trueLabel);
  pPVar4 = ParseNode::AsParseNodeTri(pnode);
  local_48 = Emit(this,pPVar4->pnode2);
  pAVar1 = &local_48.type;
  local_58 = pnode;
  pPVar4 = ParseNode::AsParseNodeTri(pnode);
  StartStatement(this,pPVar4->pnode2);
  bVar3 = AsmJsType::isInt(pAVar1);
  RVar2 = local_38;
  local_3c = tmpReg;
  if (bVar3) {
    AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Int,local_38,local_48.super_EmitInfoBase.location);
    AsmJsFunc::ReleaseLocation<int>(this->mFunction,&local_48);
    AsmJsFunc::ReleaseTmpRegister<double>(this->mFunction,local_34);
    AsmJsFunc::ReleaseTmpRegister<float>(this->mFunction,tmpReg);
    uVar5 = 0;
    local_40 = RVar2;
  }
  else {
    bVar3 = AsmJsType::isDouble(pAVar1);
    RVar2 = local_34;
    if (bVar3) {
      AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Db,local_34,local_48.super_EmitInfoBase.location);
      AsmJsFunc::ReleaseLocation<double>(this->mFunction,&local_48);
      AsmJsFunc::ReleaseTmpRegister<int>(this->mFunction,local_38);
      AsmJsFunc::ReleaseTmpRegister<float>(this->mFunction,local_3c);
      uVar5 = 0x200000000;
      local_40 = RVar2;
    }
    else {
      bVar3 = AsmJsType::isFloat(pAVar1);
      RVar2 = local_3c;
      if (!bVar3) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Conditional expressions must be of type int, double, or float");
        goto LAB_00866192;
      }
      AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Flt,local_3c,local_48.super_EmitInfoBase.location);
      AsmJsFunc::ReleaseLocation<float>(this->mFunction,&local_48);
      AsmJsFunc::ReleaseTmpRegister<int>(this->mFunction,local_38);
      AsmJsFunc::ReleaseTmpRegister<double>(this->mFunction,local_34);
      uVar5 = 0x300000000;
      local_40 = RVar2;
    }
  }
  this_01 = local_58;
  AsmJsByteCodeWriter::AsmBr(this_00,local_4c,AsmBr);
  pPVar4 = ParseNode::AsParseNodeTri(this_01);
  ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pPVar4->pnode2);
  AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,local_64);
  pPVar4 = ParseNode::AsParseNodeTri(this_01);
  local_60 = Emit(this,pPVar4->pnode3);
  pAVar1 = &local_60.type;
  pPVar4 = ParseNode::AsParseNodeTri(this_01);
  StartStatement(this,pPVar4->pnode3);
  bVar3 = AsmJsType::isInt(pAVar1);
  if (bVar3) {
    bVar3 = AsmJsType::isInt(&local_48.type);
    if (bVar3) {
      AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Int,local_38,local_60.super_EmitInfoBase.location);
      AsmJsFunc::ReleaseLocation<int>(this->mFunction,&local_60);
LAB_008660bd:
      AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,local_4c);
      pPVar4 = ParseNode::AsParseNodeTri(this_01);
      ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pPVar4->pnode3);
      return (EmitExpressionInfo)(uVar5 | local_40);
    }
    this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_02,L"Conditional expressions results must be the same type");
  }
  else {
    bVar3 = AsmJsType::isDouble(pAVar1);
    if (bVar3) {
      bVar3 = AsmJsType::isDouble(&local_48.type);
      if (bVar3) {
        AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Db,local_34,local_60.super_EmitInfoBase.location);
        AsmJsFunc::ReleaseLocation<double>(this->mFunction,&local_60);
        goto LAB_008660bd;
      }
      this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_02,L"Conditional expressions results must be the same type");
    }
    else {
      bVar3 = AsmJsType::isFloat(pAVar1);
      if (bVar3) {
        bVar3 = AsmJsType::isFloat(&local_48.type);
        if (bVar3) {
          AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Flt,local_3c,local_60.super_EmitInfoBase.location)
          ;
          AsmJsFunc::ReleaseLocation<float>(this->mFunction,&local_60);
          goto LAB_008660bd;
        }
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Conditional expressions results must be the same type");
      }
      else {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Conditional expressions must be of type int, double, or float");
      }
    }
  }
LAB_00866192:
  __cxa_throw(this_02,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitQMark( ParseNode * pnode )
    {
        StartStatement(pnode->AsParseNodeTri()->pnode1);
        Js::ByteCodeLabel trueLabel = mWriter.DefineLabel();
        Js::ByteCodeLabel falseLabel = mWriter.DefineLabel();
        Js::ByteCodeLabel skipLabel = mWriter.DefineLabel();
        EndStatement(pnode->AsParseNodeTri()->pnode1);
        const EmitExpressionInfo& boolInfo = EmitBooleanExpression( pnode->AsParseNodeTri()->pnode1, trueLabel, falseLabel );
        mFunction->ReleaseLocationGeneric( &boolInfo );

        RegSlot intReg = mFunction->AcquireTmpRegister<int>();
        RegSlot doubleReg = mFunction->AcquireTmpRegister<double>();
        RegSlot floatReg = mFunction->AcquireTmpRegister<float>();
        EmitExpressionInfo emitInfo( AsmJsType::Void );


        mWriter.MarkAsmJsLabel( trueLabel );
        const EmitExpressionInfo& trueInfo = Emit( pnode->AsParseNodeTri()->pnode2 );
        StartStatement(pnode->AsParseNodeTri()->pnode2);
        if( trueInfo.type.isInt() )
        {
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Int, intReg, trueInfo.location );
            mFunction->ReleaseLocation<int>( &trueInfo );
            mFunction->ReleaseTmpRegister<double>(doubleReg);
            mFunction->ReleaseTmpRegister<float>(floatReg);
            emitInfo.location = intReg;
            emitInfo.type = AsmJsType::Int;
        }
        else if( trueInfo.type.isDouble() )
        {
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Db, doubleReg, trueInfo.location );
            mFunction->ReleaseLocation<double>( &trueInfo );
            mFunction->ReleaseTmpRegister<int>( intReg );
            mFunction->ReleaseTmpRegister<float>(floatReg);
            emitInfo.location = doubleReg;
            emitInfo.type = AsmJsType::Double;
        }
        else if (trueInfo.type.isFloat())
        {
            mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, floatReg, trueInfo.location);
            mFunction->ReleaseLocation<float>(&trueInfo);
            mFunction->ReleaseTmpRegister<int>(intReg);
            mFunction->ReleaseTmpRegister<double>(doubleReg);
            emitInfo.location = floatReg;
            emitInfo.type = AsmJsType::Float;
        }
        else
        {
            throw AsmJsCompilationException(_u("Conditional expressions must be of type int, double, or float"));
        }
        mWriter.AsmBr( skipLabel );
        EndStatement(pnode->AsParseNodeTri()->pnode2);
        mWriter.MarkAsmJsLabel( falseLabel );
        const EmitExpressionInfo& falseInfo = Emit( pnode->AsParseNodeTri()->pnode3 );
        StartStatement(pnode->AsParseNodeTri()->pnode3);
        if( falseInfo.type.isInt() )
        {
            if( !trueInfo.type.isInt() )
            {
                throw AsmJsCompilationException( _u("Conditional expressions results must be the same type") );
            }
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Int, intReg, falseInfo.location );
            mFunction->ReleaseLocation<int>( &falseInfo );
        }
        else if( falseInfo.type.isDouble() )
        {
            if( !trueInfo.type.isDouble() )
            {
                throw AsmJsCompilationException( _u("Conditional expressions results must be the same type") );
            }
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Db, doubleReg, falseInfo.location );
            mFunction->ReleaseLocation<double>( &falseInfo );
        }
        else if(falseInfo.type.isFloat())
        {
            if (!trueInfo.type.isFloat())
            {
                throw AsmJsCompilationException(_u("Conditional expressions results must be the same type"));
            }
            mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, floatReg, falseInfo.location);
            mFunction->ReleaseLocation<float>(&falseInfo);
        }
        else
        {
            throw AsmJsCompilationException(_u("Conditional expressions must be of type int, double, or float"));
        }
        mWriter.MarkAsmJsLabel( skipLabel );
        EndStatement(pnode->AsParseNodeTri()->pnode3);
        return emitInfo;
    }